

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.h
# Opt level: O2

Field<unsigned_short> * __thiscall
ki::dml::Record::add_field<unsigned_short>(Record *this,string *name,bool transferable)

{
  Field<unsigned_short> *this_00;
  bool bVar1;
  mapped_type *ppFVar2;
  Field<unsigned_short> *this_01;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  bVar1 = has_field(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    ppFVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
              ::at(&this->m_field_map,name);
    this_00 = (Field<unsigned_short> *)*ppFVar2;
    bVar1 = FieldBase::is_type<unsigned_short>((FieldBase *)this_00);
    if (bVar1) {
      this_01 = (Field<unsigned_short> *)0x0;
      if ((this_00->super_FieldBase).super_Serializable._vptr_Serializable ==
          (_func_int **)&PTR_write_to_00193c18) {
        this_01 = this_00;
      }
    }
    else {
      this_01 = (Field<unsigned_short> *)0x0;
    }
  }
  else {
    this_01 = (Field<unsigned_short> *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_60,(string *)name);
    Field<unsigned_short>::Field(this_01,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    (this_01->super_FieldBase).m_transferable = transferable;
    add_field(this,(FieldBase *)this_01);
  }
  return this_01;
}

Assistant:

Field<ValueT> *add_field(std::string name, bool transferable = true)
		{
			// Does this field already exist?
			if (has_field(name))
			{
				// Return nullptr if the type is not the same
				auto *field = m_field_map.at(name);
				if (!field->is_type<ValueT>())
					return nullptr;
				return dynamic_cast<Field<ValueT> *>(field);
			}

			// Create the field
			auto *field = new Field<ValueT>(name);
			field->m_transferable = transferable;
			add_field(field);
			return field;
		}